

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cpp
# Opt level: O3

size_type fs_get_permissions(char *path,char *result,size_type buffer_size)

{
  string_view path_00;
  size_type sVar1;
  size_t unaff_R12;
  char *unaff_R14;
  string_view s;
  long *local_40;
  size_t local_38;
  long local_30 [2];
  
  strlen(path);
  path_00._M_str = unaff_R14;
  path_00._M_len = unaff_R12;
  fs_get_permissions_abi_cxx11_(path_00);
  s._M_str = (char *)local_40;
  s._M_len = local_38;
  sVar1 = fs_str2char(s,result,buffer_size);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return sVar1;
}

Assistant:

std::string::size_type fs_get_permissions(const char* path,
                         char* result, const std::string::size_type buffer_size){
  return fs_str2char(fs_get_permissions(path), result, buffer_size);
}